

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O2

void __thiscall Configuration::Configuration(Configuration *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *Result;
  int iVar1;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  string *psVar6;
  bool bVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_7a;
  allocator local_79;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  string *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  is_any_ofF<char> local_48;
  
  this->m_debug = false;
  this->m_verbose = false;
  (this->m_baseURL)._M_dataplus._M_p = (pointer)&(this->m_baseURL).field_2;
  (this->m_baseURL)._M_string_length = 0;
  (this->m_baseURL).field_2._M_local_buf[0] = '\0';
  (this->m_baseDir)._M_dataplus._M_p = (pointer)&(this->m_baseDir).field_2;
  (this->m_baseDir)._M_string_length = 0;
  (this->m_baseDir).field_2._M_local_buf[0] = '\0';
  (this->m_username)._M_dataplus._M_p = (pointer)&(this->m_username).field_2;
  (this->m_username)._M_string_length = 0;
  (this->m_username).field_2._M_local_buf[0] = '\0';
  psVar6 = &this->m_password;
  (this->m_password)._M_dataplus._M_p = (pointer)&(this->m_password).field_2;
  (this->m_password)._M_string_length = 0;
  (this->m_password).field_2._M_local_buf[0] = '\0';
  this->m_segment_duration = 0;
  this->m_max_backlog_total_segment_duration = 300;
  std::__cxx11::string::string((string *)&local_68,".ts",&local_79);
  local_78 = &this->m_extensions;
  __l._M_len = 1;
  __l._M_array = &local_68;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_78,__l,&local_7a);
  std::__cxx11::string::~string((string *)&local_68);
  pcVar2 = getenv("CAMERA_DEBUG");
  if (pcVar2 != (char *)0x0) {
    bVar7 = true;
    local_70 = psVar6;
    if (*pcVar2 != '\0') {
      iVar1 = strncasecmp(pcVar2,"true",4);
      if (iVar1 != 0) {
        lVar3 = strtol(pcVar2,(char **)0x0,0);
        bVar7 = lVar3 != 0;
      }
    }
    this->m_debug = bVar7;
    psVar6 = local_70;
  }
  pcVar2 = getenv("CAMERA_BASE_URL");
  Result = local_78;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->m_baseURL);
  }
  pcVar2 = getenv("CAMERA_BASE_DIR");
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->m_baseDir);
  }
  pcVar2 = getenv("CAMERA_USERNAME");
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->m_username);
  }
  pcVar2 = getenv("CAMERA_PASSWORD");
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::assign((char *)psVar6);
  }
  pcVar2 = getenv("CAMERA_SEGMENT_DURATION");
  if (pcVar2 != (char *)0x0) {
    sVar4 = strtoll(pcVar2,(char **)0x0,10);
    this->m_segment_duration = sVar4;
  }
  pcVar2 = getenv("CAMERA_MAX_BACKLOG_TOTAL_SEGMENT_DURATION");
  if (pcVar2 == (char *)0x0) {
    uVar5 = this->m_max_backlog_total_segment_duration;
  }
  else {
    uVar5 = strtoll(pcVar2,(char **)0x0,10);
    this->m_max_backlog_total_segment_duration = uVar5;
  }
  if ((uVar5 != 0) && (uVar5 < this->m_segment_duration)) {
    this->m_max_backlog_total_segment_duration = this->m_segment_duration;
  }
  local_68._M_dataplus._M_p = getenv("CAMERA_SEGMENT_EXTENSIONS");
  if (local_68._M_dataplus._M_p != (char *)0x0) {
    boost::algorithm::is_any_of<char[3]>(&local_48,(char (*) [3])" \t");
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char*&,boost::algorithm::detail::is_any_ofF<char>>
              (Result,(char **)&local_68,&local_48,token_compress_on);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_48);
  }
  return;
}

Assistant:

Configuration::Configuration()
{
    char* pValue;

    if ((pValue = getenv("CAMERA_DEBUG")) != nullptr)
    {
        m_debug = strlen(pValue) == 0 || strncasecmp(pValue, "true", 4) == 0 || strtol(pValue, nullptr, 0) != 0;
    }

    if ((pValue = getenv("CAMERA_BASE_URL")) != nullptr)
    {
        m_baseURL = pValue;
    }

    if ((pValue = getenv("CAMERA_BASE_DIR")) != nullptr)
    {
        m_baseDir = pValue;
    }

    if ((pValue = getenv("CAMERA_USERNAME")) != nullptr)
    {
        m_username = pValue;
    }

    if ((pValue = getenv("CAMERA_PASSWORD")) != nullptr)
    {
        m_password = pValue;
    }

    if ((pValue = getenv("CAMERA_SEGMENT_DURATION")) != nullptr)
    {
        m_segment_duration = static_cast<size_t>(strtoll(pValue, nullptr, 10));
    }

    if ((pValue = getenv("CAMERA_MAX_BACKLOG_TOTAL_SEGMENT_DURATION")) != nullptr)
    {
        m_max_backlog_total_segment_duration = static_cast<size_t>(strtoll(pValue, nullptr, 10));
    }

    // It makes sense to keep at least one file around...
    if (m_max_backlog_total_segment_duration > 0 && m_max_backlog_total_segment_duration < m_segment_duration)
    {
        m_max_backlog_total_segment_duration = m_segment_duration;
    }

    if ((pValue = getenv("CAMERA_SEGMENT_EXTENSIONS")) != nullptr)
    {
        boost::algorithm::split(m_extensions, pValue, boost::algorithm::is_any_of(" \t"), boost::algorithm::token_compress_on);
    }
}